

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O3

char * stringcache_len_internal(StringCache *cache,char *str,uint len,int addmissing)

{
  StringBucket **ppSVar1;
  char *__s1;
  uint uVar2;
  int iVar3;
  StringBucket *pSVar4;
  StringBucket *pSVar5;
  ulong uVar6;
  StringBucket *pSVar7;
  ulong __n;
  
  __n = (ulong)len;
  if (len == 0) {
    uVar2 = 5;
  }
  else {
    uVar2 = 0x1505;
    uVar6 = 0;
    do {
      uVar2 = (uint)(byte)str[uVar6] ^ uVar2 * 0x21;
      uVar6 = uVar6 + 1;
    } while (__n != uVar6);
    uVar2 = uVar2 & 0xff;
  }
  uVar2 = cache->table_size + 0xff & uVar2;
  ppSVar1 = cache->hashtable;
  if (ppSVar1[uVar2] != (StringBucket *)0x0) {
    pSVar5 = ppSVar1[uVar2];
    pSVar7 = (StringBucket *)0x0;
    do {
      pSVar4 = pSVar5;
      __s1 = pSVar4->string;
      iVar3 = strncmp(__s1,str,__n);
      if ((iVar3 == 0) && (__s1[__n] == '\0')) {
        if (pSVar7 == (StringBucket *)0x0) {
          return __s1;
        }
        if (pSVar7->next == pSVar4) {
          pSVar7->next = pSVar4->next;
          pSVar4->next = ppSVar1[uVar2];
          ppSVar1[uVar2] = pSVar4;
          return __s1;
        }
        __assert_fail("prev->next == bucket",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_common.c"
                      ,0x173,
                      "const char *stringcache_len_internal(StringCache *, const char *, const unsigned int, const int)"
                     );
      }
      pSVar5 = pSVar4->next;
      pSVar7 = pSVar4;
    } while (pSVar4->next != (StringBucket *)0x0);
  }
  if ((addmissing != 0) &&
     (pSVar5 = (StringBucket *)(*cache->m)(len + 0x11,cache->d), pSVar5 != (StringBucket *)0x0)) {
    pSVar5->string = (char *)(pSVar5 + 1);
    memcpy(pSVar5 + 1,str,__n);
    *(undefined1 *)((long)&pSVar5[1].string + __n) = 0;
    ppSVar1 = cache->hashtable;
    pSVar5->next = ppSVar1[uVar2];
    ppSVar1[uVar2] = pSVar5;
    return pSVar5->string;
  }
  return (char *)0x0;
}

Assistant:

static const char *stringcache_len_internal(StringCache *cache,
                                            const char *str,
                                            const unsigned int len,
                                            const int addmissing)
{
    const uint8 hash = hash_string(str, len) & (cache->table_size-1);
    StringBucket *bucket = cache->hashtable[hash];
    StringBucket *prev = NULL;
    while (bucket)
    {
        const char *bstr = bucket->string;
        if ((strncmp(bstr, str, len) == 0) && (bstr[len] == 0))
        {
            // Matched! Move this to the front of the list.
            if (prev != NULL)
            {
                assert(prev->next == bucket);
                prev->next = bucket->next;
                bucket->next = cache->hashtable[hash];
                cache->hashtable[hash] = bucket;
            } // if
            return bstr; // already cached
        } // if
        prev = bucket;
        bucket = bucket->next;
    } // while

    // no match!
    if (!addmissing)
        return NULL;

    // add to the table.
    bucket = (StringBucket *) cache->m(sizeof (StringBucket) + len + 1, cache->d);
    if (bucket == NULL)
        return NULL;
    bucket->string = (char *)(bucket + 1);
    memcpy(bucket->string, str, len);
    bucket->string[len] = '\0';
    bucket->next = cache->hashtable[hash];
    cache->hashtable[hash] = bucket;
    return bucket->string;
}